

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaParser::CopyVertex
          (ColladaParser *this,size_t currentVertex,size_t numOffsets,size_t numPoints,
          size_t perVertexOffset,Mesh *pMesh,
          vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
          *pPerIndexChannels,size_t currentPrimitive,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *indices)

{
  pointer *ppuVar1;
  unsigned_long *__args;
  iterator __position;
  long lVar2;
  pointer pInput;
  InputChannel *pInput_00;
  
  lVar2 = (numPoints * currentPrimitive + currentVertex) * numOffsets;
  if ((ulong)((long)(indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) <= (numOffsets + lVar2) - 1) {
    __assert_fail("(baseOffset + numOffsets - 1) < indices.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.cpp"
                  ,0xa63,
                  "void Assimp::ColladaParser::CopyVertex(size_t, size_t, size_t, size_t, Mesh *, std::vector<InputChannel> &, size_t, const std::vector<size_t> &)"
                 );
  }
  pInput = (pMesh->mPerVertexData).
           super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pInput != (pMesh->mPerVertexData).
                super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      ExtractDataObjectFromChannel
                (this,pInput,
                 (indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar2 + perVertexOffset],pMesh);
      pInput = pInput + 1;
    } while (pInput != (pMesh->mPerVertexData).
                       super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pInput_00 = (pPerIndexChannels->
              super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
              )._M_impl.super__Vector_impl_data._M_start;
  if (pInput_00 !=
      (pPerIndexChannels->
      super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      ExtractDataObjectFromChannel
                (this,pInput_00,
                 (indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar2 + pInput_00->mOffset],pMesh);
      pInput_00 = pInput_00 + 1;
    } while (pInput_00 !=
             (pPerIndexChannels->
             super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  __args = (indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start + lVar2 + perVertexOffset;
  __position._M_current =
       (pMesh->mFacePosIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pMesh->mFacePosIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&pMesh->mFacePosIndices,
               __position,__args);
    return;
  }
  *__position._M_current = *__args;
  ppuVar1 = &(pMesh->mFacePosIndices).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + 1;
  return;
}

Assistant:

void ColladaParser::CopyVertex(size_t currentVertex, size_t numOffsets, size_t numPoints, size_t perVertexOffset, Mesh* pMesh, std::vector<InputChannel>& pPerIndexChannels, size_t currentPrimitive, const std::vector<size_t>& indices) {
    // calculate the base offset of the vertex whose attributes we ant to copy
    size_t baseOffset = currentPrimitive * numOffsets * numPoints + currentVertex * numOffsets;

    // don't overrun the boundaries of the index list
    ai_assert((baseOffset + numOffsets - 1) < indices.size());

    // extract per-vertex channels using the global per-vertex offset
    for (std::vector<InputChannel>::iterator it = pMesh->mPerVertexData.begin(); it != pMesh->mPerVertexData.end(); ++it)
        ExtractDataObjectFromChannel(*it, indices[baseOffset + perVertexOffset], pMesh);
    // and extract per-index channels using there specified offset
    for (std::vector<InputChannel>::iterator it = pPerIndexChannels.begin(); it != pPerIndexChannels.end(); ++it)
        ExtractDataObjectFromChannel(*it, indices[baseOffset + it->mOffset], pMesh);

    // store the vertex-data index for later assignment of bone vertex weights
    pMesh->mFacePosIndices.push_back(indices[baseOffset + perVertexOffset]);
}